

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O1

void test_bson_iter_as_double(void)

{
  char cVar1;
  int iVar2;
  long lVar3;
  bson_t *pbVar4;
  undefined1 *puVar5;
  char *pcVar6;
  ulong uVar7;
  undefined1 *puVar8;
  undefined8 *puVar9;
  bson_t *pbVar10;
  bson_t *pbVar11;
  bson_t *pbVar12;
  TestSuite *suite;
  bson_t *pbVar13;
  double dVar14;
  undefined1 auVar15 [16];
  bson_iter_t iter;
  bson_t b;
  undefined1 auStack_2818 [4104];
  bson_t *pbStack_1810;
  code *pcStack_1808;
  undefined8 uStack_1790;
  undefined1 uStack_1788;
  TestSuite aTStack_1780 [5];
  code *pcStack_1688;
  int *piStack_1610;
  int iStack_1608;
  undefined1 auStack_1604 [4];
  undefined1 auStack_1600 [232];
  bson_t *pbStack_1518;
  undefined1 *puStack_1510;
  code *pcStack_1508;
  bson_t bStack_1500;
  bson_t abStack_1480 [2];
  undefined8 uStack_1348;
  char *pcStack_1340;
  bson_t *pbStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  bson_t *pbStack_1320;
  char *pcStack_1318;
  code *pcStack_1308;
  undefined1 auStack_1300 [128];
  undefined1 auStack_1280 [232];
  undefined1 *puStack_1198;
  undefined1 *puStack_1190;
  code *pcStack_1188;
  undefined1 auStack_1180 [128];
  undefined1 auStack_1100 [368];
  undefined1 *puStack_f90;
  code *pcStack_f88;
  undefined1 auStack_f80 [128];
  undefined1 auStack_f00 [128];
  undefined1 auStack_e80 [128];
  undefined1 auStack_e00 [368];
  undefined8 *puStack_c90;
  code *apcStack_c88 [13];
  undefined8 uStack_c20;
  undefined8 uStack_c18;
  undefined1 auStack_c10 [16];
  undefined8 auStack_c00 [14];
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined1 auStack_b80 [360];
  undefined1 *puStack_a18;
  code *pcStack_a08;
  undefined1 auStack_a00 [128];
  undefined1 auStack_980 [368];
  undefined1 *puStack_810;
  code *pcStack_808;
  undefined1 auStack_800 [128];
  undefined1 auStack_780 [368];
  undefined1 *puStack_610;
  code *pcStack_608;
  undefined1 auStack_600 [128];
  undefined1 auStack_580 [368];
  undefined1 *puStack_410;
  code *pcStack_408;
  undefined1 auStack_400 [128];
  undefined1 auStack_380 [368];
  undefined1 *puStack_210;
  code *pcStack_208;
  undefined1 auStack_200 [128];
  undefined1 local_180 [368];
  
  pcStack_208 = (code *)0x12b047;
  bson_init(local_180);
  pcStack_208 = (code *)0x12b063;
  cVar1 = bson_append_double(0x4093487e5c91d14e,local_180,"key",0xffffffff);
  if (cVar1 == '\0') {
    pcStack_208 = (code *)0x12b1c6;
    test_bson_iter_as_double_cold_1();
LAB_0012b1c6:
    pcStack_208 = (code *)0x12b1cb;
    test_bson_iter_as_double_cold_2();
LAB_0012b1cb:
    pcStack_208 = (code *)0x12b1d0;
    test_bson_iter_as_double_cold_3();
LAB_0012b1d0:
    pcStack_208 = (code *)0x12b1d5;
    test_bson_iter_as_double_cold_4();
LAB_0012b1d5:
    pcStack_208 = (code *)0x12b1da;
    test_bson_iter_as_double_cold_5();
LAB_0012b1da:
    pcStack_208 = (code *)0x12b1df;
    test_bson_iter_as_double_cold_6();
LAB_0012b1df:
    pcStack_208 = (code *)0x12b1e4;
    test_bson_iter_as_double_cold_7();
LAB_0012b1e4:
    pcStack_208 = (code *)0x12b1e9;
    test_bson_iter_as_double_cold_8();
LAB_0012b1e9:
    pcStack_208 = (code *)0x12b1ee;
    test_bson_iter_as_double_cold_9();
LAB_0012b1ee:
    pcStack_208 = (code *)0x12b1f3;
    test_bson_iter_as_double_cold_10();
LAB_0012b1f3:
    pcStack_208 = (code *)0x12b1f8;
    test_bson_iter_as_double_cold_11();
  }
  else {
    pcStack_208 = (code *)0x12b082;
    cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
    if (cVar1 == '\0') goto LAB_0012b1c6;
    pcStack_208 = (code *)0x12b092;
    iVar2 = bson_iter_type(auStack_200);
    if (iVar2 != 1) goto LAB_0012b1cb;
    pcStack_208 = (code *)0x12b0a3;
    dVar14 = (double)bson_iter_as_double(auStack_200);
    if ((dVar14 != 1234.1234) || (NAN(dVar14))) goto LAB_0012b1d0;
    pcStack_208 = (code *)0x12b0c7;
    bson_destroy(local_180);
    pcStack_208 = (code *)0x12b0cf;
    bson_init(local_180);
    pcStack_208 = (code *)0x12b0e8;
    cVar1 = bson_append_int32(local_180,"key",0xffffffff,0x4d2);
    if (cVar1 == '\0') goto LAB_0012b1d5;
    pcStack_208 = (code *)0x12b107;
    cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
    if (cVar1 == '\0') goto LAB_0012b1da;
    pcStack_208 = (code *)0x12b117;
    iVar2 = bson_iter_type(auStack_200);
    if (iVar2 != 0x10) goto LAB_0012b1df;
    pcStack_208 = (code *)0x12b128;
    dVar14 = (double)bson_iter_as_double(auStack_200);
    if ((dVar14 != 1234.0) || (NAN(dVar14))) goto LAB_0012b1e4;
    pcStack_208 = (code *)0x12b14c;
    bson_destroy(local_180);
    pcStack_208 = (code *)0x12b154;
    bson_init(local_180);
    pcStack_208 = (code *)0x12b16d;
    cVar1 = bson_append_int64(local_180,"key",0xffffffff,0x10e1);
    if (cVar1 == '\0') goto LAB_0012b1e9;
    pcStack_208 = (code *)0x12b188;
    cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
    if (cVar1 == '\0') goto LAB_0012b1ee;
    pcStack_208 = (code *)0x12b194;
    iVar2 = bson_iter_type(auStack_200);
    if (iVar2 != 0x12) goto LAB_0012b1f3;
    pcStack_208 = (code *)0x12b1a1;
    dVar14 = (double)bson_iter_as_double(auStack_200);
    if ((dVar14 == 4321.0) && (!NAN(dVar14))) {
      pcStack_208 = (code *)0x12b1ba;
      bson_destroy(local_180);
      return;
    }
  }
  pcStack_208 = test_bson_iter_overwrite_int32;
  test_bson_iter_as_double_cold_12();
  puVar5 = auStack_380;
  pcStack_408 = (code *)0x12b21d;
  puStack_210 = local_180;
  pcStack_208 = (code *)&stack0xfffffffffffffff8;
  bson_init(puVar5);
  pcStack_408 = (code *)0x12b236;
  cVar1 = bson_append_int32(puVar5,"key",0xffffffff,0x4d2);
  if (cVar1 == '\0') {
    pcStack_408 = (code *)0x12b2c6;
    test_bson_iter_overwrite_int32_cold_1();
LAB_0012b2c6:
    pcStack_408 = (code *)0x12b2cb;
    test_bson_iter_overwrite_int32_cold_2();
LAB_0012b2cb:
    pcStack_408 = (code *)0x12b2d0;
    test_bson_iter_overwrite_int32_cold_3();
LAB_0012b2d0:
    pcStack_408 = (code *)0x12b2d5;
    test_bson_iter_overwrite_int32_cold_4();
LAB_0012b2d5:
    pcStack_408 = (code *)0x12b2da;
    test_bson_iter_overwrite_int32_cold_5();
  }
  else {
    pcStack_408 = (code *)0x12b255;
    cVar1 = bson_iter_init_find(auStack_400,auStack_380,"key");
    if (cVar1 == '\0') goto LAB_0012b2c6;
    pcStack_408 = (code *)0x12b261;
    iVar2 = bson_iter_type(auStack_400);
    if (iVar2 != 0x10) goto LAB_0012b2cb;
    pcStack_408 = (code *)0x12b276;
    bson_iter_overwrite_int32(auStack_400,0x10e1);
    pcStack_408 = (code *)0x12b28d;
    cVar1 = bson_iter_init_find(auStack_400,auStack_380,"key");
    puVar5 = auStack_400;
    if (cVar1 == '\0') goto LAB_0012b2d0;
    pcStack_408 = (code *)0x12b299;
    iVar2 = bson_iter_type(auStack_400);
    puVar5 = auStack_400;
    if (iVar2 != 0x10) goto LAB_0012b2d5;
    pcStack_408 = (code *)0x12b2a6;
    iVar2 = bson_iter_int32(auStack_400);
    puVar5 = auStack_400;
    if (iVar2 == 0x10e1) {
      pcStack_408 = (code *)0x12b2ba;
      bson_destroy(auStack_380);
      return;
    }
  }
  pcStack_408 = test_bson_iter_overwrite_int64;
  test_bson_iter_overwrite_int32_cold_6();
  puVar8 = auStack_580;
  pcStack_608 = (code *)0x12b2ff;
  puStack_410 = puVar5;
  pcStack_408 = (code *)&pcStack_208;
  bson_init(puVar8);
  pcStack_608 = (code *)0x12b318;
  cVar1 = bson_append_int64(puVar8,"key",0xffffffff,0x4d2);
  if (cVar1 == '\0') {
    pcStack_608 = (code *)0x12b3a9;
    test_bson_iter_overwrite_int64_cold_1();
LAB_0012b3a9:
    pcStack_608 = (code *)0x12b3ae;
    test_bson_iter_overwrite_int64_cold_2();
LAB_0012b3ae:
    pcStack_608 = (code *)0x12b3b3;
    test_bson_iter_overwrite_int64_cold_3();
LAB_0012b3b3:
    pcStack_608 = (code *)0x12b3b8;
    test_bson_iter_overwrite_int64_cold_4();
LAB_0012b3b8:
    pcStack_608 = (code *)0x12b3bd;
    test_bson_iter_overwrite_int64_cold_5();
  }
  else {
    pcStack_608 = (code *)0x12b337;
    cVar1 = bson_iter_init_find(auStack_600,auStack_580,"key");
    if (cVar1 == '\0') goto LAB_0012b3a9;
    pcStack_608 = (code *)0x12b343;
    iVar2 = bson_iter_type(auStack_600);
    if (iVar2 != 0x12) goto LAB_0012b3ae;
    pcStack_608 = (code *)0x12b358;
    bson_iter_overwrite_int64(auStack_600,0x1221);
    pcStack_608 = (code *)0x12b36f;
    cVar1 = bson_iter_init_find(auStack_600,auStack_580,"key");
    puVar8 = auStack_600;
    if (cVar1 == '\0') goto LAB_0012b3b3;
    pcStack_608 = (code *)0x12b37b;
    iVar2 = bson_iter_type(auStack_600);
    puVar8 = auStack_600;
    if (iVar2 != 0x12) goto LAB_0012b3b8;
    pcStack_608 = (code *)0x12b388;
    lVar3 = bson_iter_int64(auStack_600);
    puVar8 = auStack_600;
    if (lVar3 == 0x1221) {
      pcStack_608 = (code *)0x12b39d;
      bson_destroy(auStack_580);
      return;
    }
  }
  pcStack_608 = test_bson_iter_overwrite_double;
  test_bson_iter_overwrite_int64_cold_6();
  puVar5 = auStack_780;
  pcStack_808 = (code *)0x12b3e2;
  puStack_610 = puVar8;
  pcStack_608 = (code *)&pcStack_408;
  bson_init(puVar5);
  pcStack_808 = (code *)0x12b3fe;
  cVar1 = bson_append_double(0x4093487e5c91d14e,puVar5,"key",0xffffffff);
  if (cVar1 == '\0') {
    pcStack_808 = (code *)0x12b496;
    test_bson_iter_overwrite_double_cold_1();
LAB_0012b496:
    pcStack_808 = (code *)0x12b49b;
    test_bson_iter_overwrite_double_cold_2();
LAB_0012b49b:
    pcStack_808 = (code *)0x12b4a0;
    test_bson_iter_overwrite_double_cold_3();
LAB_0012b4a0:
    pcStack_808 = (code *)0x12b4a5;
    test_bson_iter_overwrite_double_cold_4();
LAB_0012b4a5:
    pcStack_808 = (code *)0x12b4aa;
    test_bson_iter_overwrite_double_cold_5();
  }
  else {
    pcStack_808 = (code *)0x12b41d;
    cVar1 = bson_iter_init_find(auStack_800,auStack_780,"key");
    if (cVar1 == '\0') goto LAB_0012b496;
    pcStack_808 = (code *)0x12b429;
    iVar2 = bson_iter_type(auStack_800);
    if (iVar2 != 1) goto LAB_0012b49b;
    pcStack_808 = (code *)0x12b441;
    bson_iter_overwrite_double(0x40b2211f97247454,auStack_800);
    pcStack_808 = (code *)0x12b458;
    cVar1 = bson_iter_init_find(auStack_800,auStack_780,"key");
    puVar5 = auStack_800;
    if (cVar1 == '\0') goto LAB_0012b4a0;
    pcStack_808 = (code *)0x12b464;
    iVar2 = bson_iter_type(auStack_800);
    puVar5 = auStack_800;
    if (iVar2 != 1) goto LAB_0012b4a5;
    pcStack_808 = (code *)0x12b471;
    dVar14 = (double)bson_iter_double(auStack_800);
    puVar5 = auStack_800;
    if ((dVar14 == 4641.1234) && (puVar5 = auStack_800, !NAN(dVar14))) {
      pcStack_808 = (code *)0x12b48a;
      bson_destroy(auStack_780);
      return;
    }
  }
  pcStack_808 = test_bson_iter_overwrite_bool;
  test_bson_iter_overwrite_double_cold_6();
  puVar8 = auStack_980;
  pcStack_a08 = (code *)0x12b4cf;
  puStack_810 = puVar5;
  pcStack_808 = (code *)&pcStack_608;
  bson_init(puVar8);
  pcStack_a08 = (code *)0x12b4e8;
  cVar1 = bson_append_bool(puVar8,"key",0xffffffff,1);
  if (cVar1 == '\0') {
    pcStack_a08 = (code *)0x12b56e;
    test_bson_iter_overwrite_bool_cold_1();
LAB_0012b56e:
    pcStack_a08 = (code *)0x12b573;
    test_bson_iter_overwrite_bool_cold_2();
LAB_0012b573:
    pcStack_a08 = (code *)0x12b578;
    test_bson_iter_overwrite_bool_cold_3();
LAB_0012b578:
    pcStack_a08 = (code *)0x12b57d;
    test_bson_iter_overwrite_bool_cold_4();
LAB_0012b57d:
    pcStack_a08 = (code *)0x12b582;
    test_bson_iter_overwrite_bool_cold_5();
  }
  else {
    pcStack_a08 = (code *)0x12b503;
    cVar1 = bson_iter_init_find(auStack_a00,auStack_980,"key");
    if (cVar1 == '\0') goto LAB_0012b56e;
    pcStack_a08 = (code *)0x12b50f;
    iVar2 = bson_iter_type(auStack_a00);
    if (iVar2 != 8) goto LAB_0012b573;
    pcStack_a08 = (code *)0x12b521;
    bson_iter_overwrite_bool(auStack_a00,0);
    pcStack_a08 = (code *)0x12b538;
    cVar1 = bson_iter_init_find(auStack_a00,auStack_980,"key");
    puVar8 = auStack_a00;
    if (cVar1 == '\0') goto LAB_0012b578;
    pcStack_a08 = (code *)0x12b544;
    iVar2 = bson_iter_type(auStack_a00);
    puVar8 = auStack_a00;
    if (iVar2 != 8) goto LAB_0012b57d;
    pcStack_a08 = (code *)0x12b551;
    cVar1 = bson_iter_bool(auStack_a00);
    puVar8 = auStack_a00;
    if (cVar1 == '\0') {
      pcStack_a08 = (code *)0x12b562;
      bson_destroy(auStack_980);
      return;
    }
  }
  pcStack_a08 = test_bson_iter_overwrite_decimal128;
  test_bson_iter_overwrite_bool_cold_6();
  puVar9 = &uStack_b90;
  uStack_b88 = 0;
  uStack_b90 = 1;
  uStack_c18 = 0;
  uStack_c20 = 2;
  puVar5 = auStack_b80;
  apcStack_c88[0] = (code *)0x12b5cc;
  puStack_a18 = puVar8;
  pcStack_a08 = (code *)&pcStack_808;
  bson_init(puVar5);
  apcStack_c88[0] = (code *)0x12b5e3;
  cVar1 = bson_append_decimal128(puVar5,"key",0xffffffff,puVar9);
  if (cVar1 == '\0') {
    apcStack_c88[0] = (code *)0x12b6b3;
    test_bson_iter_overwrite_decimal128_cold_1();
LAB_0012b6b3:
    apcStack_c88[0] = (code *)0x12b6b8;
    test_bson_iter_overwrite_decimal128_cold_2();
LAB_0012b6b8:
    apcStack_c88[0] = (code *)0x12b6bd;
    test_bson_iter_overwrite_decimal128_cold_3();
LAB_0012b6bd:
    apcStack_c88[0] = (code *)0x12b6c2;
    test_bson_iter_overwrite_decimal128_cold_4();
LAB_0012b6c2:
    apcStack_c88[0] = (code *)0x12b6c7;
    test_bson_iter_overwrite_decimal128_cold_5();
LAB_0012b6c7:
    apcStack_c88[0] = (code *)0x12b6cc;
    test_bson_iter_overwrite_decimal128_cold_6();
  }
  else {
    apcStack_c88[0] = (code *)0x12b607;
    cVar1 = bson_iter_init_find(auStack_c00,auStack_b80,"key");
    if (cVar1 == '\0') goto LAB_0012b6b3;
    apcStack_c88[0] = (code *)0x12b61c;
    iVar2 = bson_iter_type(auStack_c00);
    if (iVar2 != 0x13) goto LAB_0012b6b8;
    puVar9 = auStack_c00;
    apcStack_c88[0] = (code *)0x12b63a;
    bson_iter_overwrite_decimal128(puVar9,&uStack_c20);
    apcStack_c88[0] = (code *)0x12b651;
    cVar1 = bson_iter_init_find(puVar9,auStack_b80,"key");
    if (cVar1 == '\0') goto LAB_0012b6bd;
    apcStack_c88[0] = (code *)0x12b662;
    iVar2 = bson_iter_type(auStack_c00);
    if (iVar2 != 0x13) goto LAB_0012b6c2;
    apcStack_c88[0] = (code *)0x12b679;
    cVar1 = bson_iter_decimal128(auStack_c00,auStack_c10);
    if (cVar1 == '\0') goto LAB_0012b6c7;
    auVar15[0] = -((char)uStack_c20 == auStack_c10[0]);
    auVar15[1] = -(uStack_c20._1_1_ == auStack_c10[1]);
    auVar15[2] = -(uStack_c20._2_1_ == auStack_c10[2]);
    auVar15[3] = -(uStack_c20._3_1_ == auStack_c10[3]);
    auVar15[4] = -(uStack_c20._4_1_ == auStack_c10[4]);
    auVar15[5] = -(uStack_c20._5_1_ == auStack_c10[5]);
    auVar15[6] = -(uStack_c20._6_1_ == auStack_c10[6]);
    auVar15[7] = -(uStack_c20._7_1_ == auStack_c10[7]);
    auVar15[8] = -((char)uStack_c18 == auStack_c10[8]);
    auVar15[9] = -(uStack_c18._1_1_ == auStack_c10[9]);
    auVar15[10] = -(uStack_c18._2_1_ == auStack_c10[10]);
    auVar15[0xb] = -(uStack_c18._3_1_ == auStack_c10[0xb]);
    auVar15[0xc] = -(uStack_c18._4_1_ == auStack_c10[0xc]);
    auVar15[0xd] = -(uStack_c18._5_1_ == auStack_c10[0xd]);
    auVar15[0xe] = -(uStack_c18._6_1_ == auStack_c10[0xe]);
    auVar15[0xf] = -(uStack_c18._7_1_ == auStack_c10[0xf]);
    if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe | (ushort)(auVar15[0xf] >> 7) << 0xf
                ) == 0xffff) {
      apcStack_c88[0] = (code *)0x12b6a5;
      bson_destroy(auStack_b80);
      return;
    }
  }
  apcStack_c88[0] = test_bson_iter_recurse;
  test_bson_iter_overwrite_decimal128_cold_7();
  pcStack_f88 = (code *)0x12b6ee;
  puStack_c90 = puVar9;
  apcStack_c88[0] = (code *)&pcStack_a08;
  bson_init(auStack_e00);
  pcStack_f88 = (code *)0x12b6fe;
  bson_init(auStack_f00);
  pcStack_f88 = (code *)0x12b714;
  cVar1 = bson_append_int32(auStack_f00,"0",1,0);
  if (cVar1 == '\0') {
    pcStack_f88 = (code *)0x12b84e;
    test_bson_iter_recurse_cold_1();
LAB_0012b84e:
    pcStack_f88 = (code *)0x12b853;
    test_bson_iter_recurse_cold_2();
LAB_0012b853:
    pcStack_f88 = (code *)0x12b858;
    test_bson_iter_recurse_cold_3();
LAB_0012b858:
    pcStack_f88 = (code *)0x12b85d;
    test_bson_iter_recurse_cold_4();
LAB_0012b85d:
    pcStack_f88 = (code *)0x12b862;
    test_bson_iter_recurse_cold_5();
LAB_0012b862:
    pcStack_f88 = (code *)0x12b867;
    test_bson_iter_recurse_cold_6();
LAB_0012b867:
    pcStack_f88 = (code *)0x12b86c;
    test_bson_iter_recurse_cold_7();
LAB_0012b86c:
    pcStack_f88 = (code *)0x12b871;
    test_bson_iter_recurse_cold_8();
LAB_0012b871:
    pcStack_f88 = (code *)0x12b876;
    test_bson_iter_recurse_cold_9();
LAB_0012b876:
    pcStack_f88 = (code *)0x12b87b;
    test_bson_iter_recurse_cold_10();
  }
  else {
    pcStack_f88 = (code *)0x12b73a;
    cVar1 = bson_append_int32(auStack_f00,"1",1,1);
    if (cVar1 == '\0') goto LAB_0012b84e;
    pcStack_f88 = (code *)0x12b760;
    cVar1 = bson_append_int32(auStack_f00,"2",1,2);
    if (cVar1 == '\0') goto LAB_0012b853;
    pcStack_f88 = (code *)0x12b789;
    cVar1 = bson_append_array(auStack_e00,"key",0xffffffff,auStack_f00);
    if (cVar1 == '\0') goto LAB_0012b858;
    pcStack_f88 = (code *)0x12b7ad;
    cVar1 = bson_iter_init_find(auStack_e80,auStack_e00,"key");
    if (cVar1 == '\0') goto LAB_0012b85d;
    pcStack_f88 = (code *)0x12b7c2;
    iVar2 = bson_iter_type(auStack_e80);
    if (iVar2 != 4) goto LAB_0012b862;
    pcStack_f88 = (code *)0x12b7db;
    cVar1 = bson_iter_recurse(auStack_e80,auStack_f80);
    if (cVar1 == '\0') goto LAB_0012b867;
    pcStack_f88 = (code *)0x12b7f2;
    cVar1 = bson_iter_find(auStack_f80,"0");
    if (cVar1 == '\0') goto LAB_0012b86c;
    pcStack_f88 = (code *)0x12b805;
    cVar1 = bson_iter_find(auStack_f80,"1");
    if (cVar1 == '\0') goto LAB_0012b871;
    pcStack_f88 = (code *)0x12b818;
    cVar1 = bson_iter_find(auStack_f80,"2");
    if (cVar1 == '\0') goto LAB_0012b876;
    pcStack_f88 = (code *)0x12b824;
    cVar1 = bson_iter_next(auStack_f80);
    if (cVar1 == '\0') {
      pcStack_f88 = (code *)0x12b835;
      bson_destroy(auStack_e00);
      pcStack_f88 = (code *)0x12b842;
      bson_destroy(auStack_f00);
      return;
    }
  }
  pcStack_f88 = test_bson_iter_init_find_case;
  test_bson_iter_recurse_cold_11();
  pcStack_1188 = (code *)0x12b8a0;
  puStack_f90 = auStack_f00;
  pcStack_f88 = (code *)apcStack_c88;
  bson_init(auStack_1100);
  pcStack_1188 = (code *)0x12b8b9;
  cVar1 = bson_append_int32(auStack_1100,"FOO",0xffffffff,0x4d2);
  if (cVar1 == '\0') {
    pcStack_1188 = (code *)0x12b900;
    test_bson_iter_init_find_case_cold_1();
LAB_0012b900:
    pcStack_1188 = (code *)0x12b905;
    test_bson_iter_init_find_case_cold_2();
  }
  else {
    pcStack_1188 = (code *)0x12b8d4;
    cVar1 = bson_iter_init_find_case(auStack_1180,auStack_1100,"foo");
    if (cVar1 == '\0') goto LAB_0012b900;
    pcStack_1188 = (code *)0x12b8e0;
    iVar2 = bson_iter_int32(auStack_1180);
    if (iVar2 == 0x4d2) {
      pcStack_1188 = (code *)0x12b8f4;
      bson_destroy(auStack_1100);
      return;
    }
  }
  pcStack_1188 = test_bson_iter_find_descendant;
  test_bson_iter_init_find_case_cold_3();
  pcStack_1308 = (code *)0x12b928;
  puStack_1198 = auStack_1100;
  puStack_1190 = puVar5;
  pcStack_1188 = (code *)&pcStack_f88;
  pbVar4 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/dotkey.bson"
                   );
  pcStack_1308 = (code *)0x12b93b;
  cVar1 = bson_iter_init(auStack_1280,pbVar4);
  if (cVar1 == '\0') {
    pcStack_1308 = (code *)0x12bb6c;
    test_bson_iter_find_descendant_cold_1();
LAB_0012bb6c:
    pcStack_1308 = (code *)0x12bb71;
    test_bson_iter_find_descendant_cold_2();
LAB_0012bb71:
    pcStack_1308 = (code *)0x12bb76;
    test_bson_iter_find_descendant_cold_3();
LAB_0012bb76:
    pcStack_1308 = (code *)0x12bb7b;
    test_bson_iter_find_descendant_cold_4();
LAB_0012bb7b:
    pcStack_1308 = (code *)0x12bb80;
    test_bson_iter_find_descendant_cold_5();
LAB_0012bb80:
    pcStack_1308 = (code *)0x12bb85;
    test_bson_iter_find_descendant_cold_6();
LAB_0012bb85:
    pcStack_1308 = (code *)0x12bb8a;
    test_bson_iter_find_descendant_cold_7();
LAB_0012bb8a:
    pcStack_1308 = (code *)0x12bb8f;
    test_bson_iter_find_descendant_cold_8();
LAB_0012bb8f:
    pcStack_1308 = (code *)0x12bb94;
    test_bson_iter_find_descendant_cold_9();
LAB_0012bb94:
    pcStack_1308 = (code *)0x12bb99;
    test_bson_iter_find_descendant_cold_10();
LAB_0012bb99:
    pcStack_1308 = (code *)0x12bb9e;
    test_bson_iter_find_descendant_cold_11();
LAB_0012bb9e:
    pcStack_1308 = (code *)0x12bba3;
    test_bson_iter_find_descendant_cold_12();
LAB_0012bba3:
    pcStack_1308 = (code *)0x12bba8;
    test_bson_iter_find_descendant_cold_13();
  }
  else {
    pcStack_1308 = (code *)0x12b95a;
    cVar1 = bson_iter_find_descendant(auStack_1280,"a.b.c.0",auStack_1300);
    if (cVar1 == '\0') goto LAB_0012bb6c;
    pcStack_1308 = (code *)0x12b96a;
    iVar2 = bson_iter_type(auStack_1300);
    if (iVar2 != 0x10) goto LAB_0012bb71;
    pcStack_1308 = (code *)0x12b97b;
    iVar2 = bson_iter_int32(auStack_1300);
    if (iVar2 != 1) goto LAB_0012bb76;
    pcStack_1308 = (code *)0x12b98c;
    bson_destroy(pbVar4);
    pcStack_1308 = (code *)0x12b991;
    pbVar4 = (bson_t *)bson_bcon_magic();
    pcStack_1308 = (code *)0x0;
    pcStack_1318 = "]";
    pbStack_1320 = (bson_t *)0x148ce7;
    uStack_1328 = 1;
    uStack_1330 = 0xf;
    pcStack_1340 = "baz";
    uStack_1348 = 0x12b9e0;
    pbStack_1338 = pbVar4;
    puVar5 = (undefined1 *)bcon_new(0,"foo","{","bar","[","{");
    pcStack_1308 = (code *)0x12b9f7;
    cVar1 = bson_iter_init(auStack_1280,puVar5);
    if (cVar1 == '\0') goto LAB_0012bb7b;
    pcStack_1308 = (code *)0x12ba16;
    cVar1 = bson_iter_find_descendant(auStack_1280,"foo.bar.0.baz",auStack_1300);
    if (cVar1 == '\0') goto LAB_0012bb80;
    pcStack_1308 = (code *)0x12ba26;
    iVar2 = bson_iter_type(auStack_1300);
    if (iVar2 != 0x10) goto LAB_0012bb85;
    pcStack_1308 = (code *)0x12ba37;
    iVar2 = bson_iter_int32(auStack_1300);
    if (iVar2 != 1) goto LAB_0012bb8a;
    pcStack_1308 = (code *)0x12ba48;
    bson_destroy(puVar5);
    pcStack_1308 = (code *)0x0;
    pcStack_1318 = (char *)0xf;
    uStack_1328 = 0x12ba74;
    pbStack_1320 = pbVar4;
    puVar5 = (undefined1 *)bcon_new(0,"nModified",pbVar4,0xf,1,"n");
    pcStack_1308 = (code *)0x12ba8b;
    cVar1 = bson_iter_init(auStack_1280,puVar5);
    if (cVar1 == '\0') goto LAB_0012bb8f;
    pcStack_1308 = (code *)0x12baaa;
    cVar1 = bson_iter_find_descendant(auStack_1280,"n",auStack_1300);
    if (cVar1 == '\0') goto LAB_0012bb94;
    pcStack_1308 = (code *)0x12baba;
    pcVar6 = (char *)bson_iter_key(auStack_1300);
    pcStack_1308 = (code *)0x12bac9;
    iVar2 = strcmp(pcVar6,"n");
    if (iVar2 != 0) goto LAB_0012bb99;
    pcStack_1308 = (code *)0x12bad9;
    bson_destroy(puVar5);
    pcStack_1308 = (code *)0x0;
    pcStack_1318 = (char *)0xf;
    uStack_1328 = 0x12bb05;
    pbStack_1320 = pbVar4;
    pbVar4 = (bson_t *)bcon_new(0,"",pbVar4,0xf,1,"n");
    pcStack_1308 = (code *)0x12bb1c;
    cVar1 = bson_iter_init(auStack_1280,pbVar4);
    if (cVar1 == '\0') goto LAB_0012bb9e;
    pcStack_1308 = (code *)0x12bb37;
    cVar1 = bson_iter_find_descendant(auStack_1280,"n",auStack_1300);
    if (cVar1 == '\0') goto LAB_0012bba3;
    pcStack_1308 = (code *)0x12bb43;
    pcVar6 = (char *)bson_iter_key(auStack_1300);
    pcStack_1308 = (code *)0x12bb52;
    iVar2 = strcmp(pcVar6,"n");
    if (iVar2 == 0) {
      pcStack_1308 = (code *)0x12bb5e;
      bson_destroy(pbVar4);
      return;
    }
  }
  pcStack_1308 = test_bson_iter_as_bool;
  test_bson_iter_find_descendant_cold_14();
  pbVar11 = &bStack_1500;
  pbVar12 = &bStack_1500;
  pbVar13 = &bStack_1500;
  pbVar10 = abStack_1480;
  pcStack_1508 = (code *)0x12bbd1;
  pbStack_1320 = pbVar4;
  pcStack_1318 = puVar5;
  pcStack_1308 = (code *)&pcStack_1188;
  bson_init(pbVar10);
  pcStack_1508 = (code *)0x12bbea;
  bson_append_int32(pbVar10,"int32[true]",0xffffffff,1);
  pcStack_1508 = (code *)0x12bc00;
  bson_append_int32(pbVar10,"int32[false]",0xffffffff,0);
  pcStack_1508 = (code *)0x12bc1c;
  bson_append_int64(pbVar10,"int64[true]",0xffffffff,1);
  pcStack_1508 = (code *)0x12bc35;
  bson_append_int64(pbVar10,"int64[false]",0xffffffff,0);
  pcStack_1508 = (code *)0x12bc4d;
  bson_append_double(0x3ff0000000000000,pbVar10,"int64[true]",0xffffffff);
  pcStack_1508 = (code *)0x12bc60;
  bson_append_double(pbVar10,"int64[false]",0xffffffff);
  pcStack_1508 = (code *)0x12bc6e;
  bson_iter_init(&bStack_1500,pbVar10);
  pcStack_1508 = (code *)0x12bc76;
  bson_iter_next(&bStack_1500);
  pcStack_1508 = (code *)0x12bc7e;
  cVar1 = bson_iter_as_bool(&bStack_1500);
  if (cVar1 == '\0') {
    pcStack_1508 = (code *)0x12bd16;
    test_bson_iter_as_bool_cold_1();
LAB_0012bd16:
    pcStack_1508 = (code *)0x12bd1b;
    test_bson_iter_as_bool_cold_6();
LAB_0012bd1b:
    pbVar11 = pbVar10;
    pcStack_1508 = (code *)0x12bd20;
    test_bson_iter_as_bool_cold_2();
LAB_0012bd20:
    pcStack_1508 = (code *)0x12bd25;
    test_bson_iter_as_bool_cold_5();
LAB_0012bd25:
    pbVar12 = pbVar11;
    pcStack_1508 = (code *)0x12bd2a;
    test_bson_iter_as_bool_cold_3();
  }
  else {
    pcStack_1508 = (code *)0x12bc91;
    bson_iter_next(&bStack_1500);
    pcStack_1508 = (code *)0x12bc99;
    cVar1 = bson_iter_as_bool(&bStack_1500);
    pbVar10 = &bStack_1500;
    if (cVar1 != '\0') goto LAB_0012bd16;
    pcStack_1508 = (code *)0x12bca8;
    bson_iter_next(&bStack_1500);
    pcStack_1508 = (code *)0x12bcb0;
    cVar1 = bson_iter_as_bool(&bStack_1500);
    pbVar10 = &bStack_1500;
    if (cVar1 == '\0') goto LAB_0012bd1b;
    pcStack_1508 = (code *)0x12bcbf;
    bson_iter_next(&bStack_1500);
    pcStack_1508 = (code *)0x12bcc7;
    cVar1 = bson_iter_as_bool(&bStack_1500);
    if (cVar1 != '\0') goto LAB_0012bd20;
    pcStack_1508 = (code *)0x12bcd6;
    bson_iter_next(&bStack_1500);
    pcStack_1508 = (code *)0x12bcde;
    cVar1 = bson_iter_as_bool(&bStack_1500);
    pbVar11 = &bStack_1500;
    if (cVar1 == '\0') goto LAB_0012bd25;
    pcStack_1508 = (code *)0x12bced;
    bson_iter_next(&bStack_1500);
    pcStack_1508 = (code *)0x12bcf5;
    cVar1 = bson_iter_as_bool(&bStack_1500);
    if (cVar1 == '\0') {
      pcStack_1508 = (code *)0x12bd06;
      bson_destroy(abStack_1480);
      return;
    }
  }
  pcStack_1508 = test_bson_iter_binary_deprecated;
  test_bson_iter_as_bool_cold_4();
  pcStack_1688 = (code *)0x12bd4d;
  pbStack_1518 = pbVar12;
  puStack_1510 = (undefined1 *)&bStack_1500;
  pcStack_1508 = (code *)&pcStack_1308;
  pbVar4 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/binary_deprecated.bson"
                   );
  if (pbVar4 == (bson_t *)0x0) {
    pcStack_1688 = (code *)0x12bdc2;
    test_bson_iter_binary_deprecated_cold_5();
LAB_0012bdc2:
    pcStack_1688 = (code *)0x12bdc7;
    test_bson_iter_binary_deprecated_cold_1();
LAB_0012bdc7:
    pcStack_1688 = (code *)0x12bdcc;
    test_bson_iter_binary_deprecated_cold_2();
LAB_0012bdcc:
    pcStack_1688 = (code *)0x12bdd1;
    test_bson_iter_binary_deprecated_cold_3();
  }
  else {
    pcStack_1688 = (code *)0x12bd65;
    cVar1 = bson_iter_init(auStack_1600,pbVar4);
    pbVar12 = pbVar4;
    if (cVar1 == '\0') goto LAB_0012bdc2;
    pcStack_1688 = (code *)0x12bd76;
    cVar1 = bson_iter_next(auStack_1600);
    if (cVar1 == '\0') goto LAB_0012bdc7;
    pbVar13 = (bson_t *)&iStack_1608;
    pcStack_1688 = (code *)0x12bd99;
    bson_iter_binary(auStack_1600,auStack_1604,pbVar13,&piStack_1610);
    if (iStack_1608 != 4) goto LAB_0012bdcc;
    if (*piStack_1610 == 0x34333231) {
      pcStack_1688 = (code *)0x12bdb4;
      bson_destroy(pbVar4);
      return;
    }
  }
  pcStack_1688 = test_bson_iter_from_data;
  test_bson_iter_binary_deprecated_cold_4();
  uStack_1790 = 0x100620800000009;
  uStack_1788 = 0;
  suite = aTStack_1780;
  pcStack_1808 = (code *)0x12be0d;
  pcStack_1688 = (code *)&pcStack_1508;
  cVar1 = bson_iter_init_from_data(suite,&uStack_1790,9);
  if (cVar1 == '\0') {
    pcStack_1808 = (code *)0x12be4f;
    test_bson_iter_from_data_cold_1();
LAB_0012be4f:
    pcStack_1808 = (code *)0x12be54;
    test_bson_iter_from_data_cold_2();
LAB_0012be54:
    pcStack_1808 = (code *)0x12be59;
    test_bson_iter_from_data_cold_3();
  }
  else {
    suite = aTStack_1780;
    pcStack_1808 = (code *)0x12be1e;
    cVar1 = bson_iter_next();
    if (cVar1 == '\0') goto LAB_0012be4f;
    suite = aTStack_1780;
    pcStack_1808 = (code *)0x12be2f;
    iVar2 = bson_iter_type();
    if (iVar2 != 8) goto LAB_0012be54;
    suite = aTStack_1780;
    pcStack_1808 = (code *)0x12be41;
    cVar1 = bson_iter_bool();
    if (cVar1 != '\0') {
      return;
    }
  }
  pcStack_1808 = get_bson;
  test_bson_iter_from_data_cold_4();
  pbStack_1810 = pbVar12;
  pcStack_1808 = (code *)pbVar13;
  iVar2 = open((char *)suite,0);
  if (iVar2 != -1) {
    uVar7 = read(iVar2,auStack_2818,0x1000);
    if ((long)uVar7 < 0) goto LAB_0012bec0;
    if (uVar7 != 0) {
      bson_new_from_data(auStack_2818,uVar7 & 0xffffffff);
      close(iVar2);
      return;
    }
    get_bson_cold_1();
  }
  get_bson_cold_3();
LAB_0012bec0:
  get_bson_cold_2();
  TestSuite_Add(suite,"/bson/as_json/x1000",test_bson_as_json_x1000);
  TestSuite_Add(suite,"/bson/as_json/multi",test_bson_as_json_multi);
  TestSuite_Add(suite,"/bson/as_json/string",test_bson_as_json_string);
  TestSuite_Add(suite,"/bson/as_json/int32",test_bson_as_json_int32);
  TestSuite_Add(suite,"/bson/as_json/int64",test_bson_as_json_int64);
  TestSuite_Add(suite,"/bson/as_json/double",test_bson_as_json_double);
  TestSuite_Add(suite,"/bson/as_json/double/nonfinite",test_bson_as_json_double_nonfinite);
  TestSuite_Add(suite,"/bson/as_json/code",test_bson_as_json_code);
  TestSuite_Add(suite,"/bson/as_json/date_time",test_bson_as_json_date_time);
  TestSuite_Add(suite,"/bson/as_json/regex",test_bson_as_json_regex);
  TestSuite_Add(suite,"/bson/as_json/symbol",test_bson_as_json_symbol);
  TestSuite_Add(suite,"/bson/as_json/utf8",test_bson_as_json_utf8);
  TestSuite_Add(suite,"/bson/as_json/dbpointer",test_bson_as_json_dbpointer);
  TestSuite_Add(suite,"/bson/as_canonical_extended_json/dbpointer",
                test_bson_as_canonical_extended_json_dbpointer);
  TestSuite_Add(suite,"/bson/as_json/stack_overflow",test_bson_as_json_stack_overflow);
  TestSuite_Add(suite,"/bson/as_json/corrupt",test_bson_corrupt);
  TestSuite_Add(suite,"/bson/as_json/corrupt_utf8",test_bson_corrupt_utf8);
  TestSuite_Add(suite,"/bson/as_json/corrupt_binary",test_bson_corrupt_binary);
  TestSuite_Add(suite,"/bson/as_json_spacing",test_bson_as_json_spacing);
  TestSuite_Add(suite,"/bson/array_as_json",test_bson_array_as_json);
  TestSuite_Add(suite,"/bson/json/allow_multiple",test_bson_json_allow_multiple);
  TestSuite_Add(suite,"/bson/json/read/buffering",test_bson_json_read_buffering);
  TestSuite_Add(suite,"/bson/json/read",test_bson_json_read);
  TestSuite_Add(suite,"/bson/json/inc",test_bson_json_inc);
  TestSuite_Add(suite,"/bson/json/array",test_bson_json_array);
  TestSuite_Add(suite,"/bson/json/array/single",test_bson_json_array_single);
  TestSuite_Add(suite,"/bson/json/array/int64",test_bson_json_array_int64);
  TestSuite_Add(suite,"/bson/json/array/subdoc",test_bson_json_array_subdoc);
  TestSuite_Add(suite,"/bson/json/date",test_bson_json_date);
  TestSuite_Add(suite,"/bson/json/date/legacy",test_bson_json_date_legacy);
  TestSuite_Add(suite,"/bson/json/date/long",test_bson_json_date_numberlong);
  TestSuite_Add(suite,"/bson/json/timestamp",test_bson_json_timestamp);
  TestSuite_Add(suite,"/bson/json/read/empty",test_bson_json_read_empty);
  TestSuite_Add(suite,"/bson/json/read/missing_complex",test_bson_json_read_missing_complex);
  TestSuite_Add(suite,"/bson/json/read/invalid_binary",test_bson_json_read_invalid_binary);
  TestSuite_Add(suite,"/bson/json/read/invalid_json",test_bson_json_read_invalid_json);
  TestSuite_Add(suite,"/bson/json/read/bad_cb",test_bson_json_read_bad_cb);
  TestSuite_Add(suite,"/bson/json/read/invalid",test_bson_json_read_invalid);
  TestSuite_Add(suite,"/bson/json/read/raw_utf8",test_bson_json_read_raw_utf8);
  TestSuite_Add(suite,"/bson/json/read/corrupt_utf8",test_bson_json_read_corrupt_utf8);
  TestSuite_Add(suite,"/bson/json/read/decimal128",test_bson_json_read_decimal128);
  TestSuite_Add(suite,"/bson/json/read/dbpointer",test_bson_json_read_dbpointer);
  TestSuite_Add(suite,"/bson/json/read/legacy_regex",test_bson_json_read_legacy_regex);
  TestSuite_Add(suite,"/bson/json/read/regex_options_order",test_bson_json_read_regex_options_order)
  ;
  TestSuite_Add(suite,"/bson/json/read/binary",test_bson_json_read_binary);
  TestSuite_Add(suite,"/bson/json/read/legacy_binary",test_bson_json_read_legacy_binary);
  TestSuite_Add(suite,"/bson/json/read/file",test_json_reader_new_from_file);
  TestSuite_Add(suite,"/bson/json/read/bad_path",test_json_reader_new_from_bad_path);
  TestSuite_Add(suite,"/bson/json/read/$numberLong",test_bson_json_number_long);
  TestSuite_Add(suite,"/bson/json/read/$numberLong/zero",test_bson_json_number_long_zero);
  TestSuite_Add(suite,"/bson/json/read/code",test_bson_json_code);
  TestSuite_Add(suite,"/bson/json/read/code/errors",test_bson_json_code_errors);
  TestSuite_Add(suite,"/bson/json/read/dbref",test_bson_json_dbref);
  TestSuite_Add(suite,"/bson/json/read/uescape",test_bson_json_uescape);
  TestSuite_Add(suite,"/bson/json/read/uescape/key",test_bson_json_uescape_key);
  TestSuite_Add(suite,"/bson/json/read/uescape/bad",test_bson_json_uescape_bad);
  TestSuite_Add(suite,"/bson/json/read/int32",test_bson_json_int32);
  TestSuite_Add(suite,"/bson/json/read/int64",test_bson_json_int64);
  TestSuite_Add(suite,"/bson/json/read/double",test_bson_json_double);
  TestSuite_Add(suite,"/bson/json/read/double/overflow",test_bson_json_double_overflow);
  TestSuite_Add(suite,"/bson/json/read/double/nan",test_bson_json_nan);
  TestSuite_Add(suite,"/bson/json/read/double/infinity",test_bson_json_infinity);
  TestSuite_Add(suite,"/bson/json/read/null",test_bson_json_null);
  TestSuite_Add(suite,"/bson/json/read/empty_final",test_bson_json_empty_final_object);
  TestSuite_Add(suite,"/bson/as_json/decimal128",test_bson_as_json_decimal128);
  TestSuite_Add(suite,"/bson/json/read/$numberDecimal",test_bson_json_number_decimal);
  TestSuite_Add(suite,"/bson/json/errors",test_bson_json_errors);
  TestSuite_Add(suite,"/bson/integer/width",test_bson_integer_width);
  TestSuite_Add(suite,"/bson/json/read/null_in_str",test_bson_json_null_in_str);
  TestSuite_Add(suite,"/bson/as_json/multi_object",test_bson_as_json_multi_object);
  return;
}

Assistant:

static void
test_bson_iter_as_double (void)
{
   bson_iter_t iter;
   bson_t b;

   bson_init (&b);
   ASSERT (bson_append_double (&b, "key", -1, 1234.1234));
   ASSERT (bson_iter_init_find (&iter, &b, "key"));
   ASSERT (BSON_ITER_HOLDS_DOUBLE (&iter));
   ASSERT (bson_iter_as_double (&iter) == 1234.1234);
   bson_destroy (&b);

   bson_init (&b);
   ASSERT (bson_append_int32 (&b, "key", -1, 1234));
   ASSERT (bson_iter_init_find (&iter, &b, "key"));
   ASSERT (BSON_ITER_HOLDS_INT32 (&iter));
   ASSERT (bson_iter_as_double (&iter) == 1234.0);
   bson_destroy (&b);

   bson_init (&b);
   ASSERT (bson_append_int64 (&b, "key", -1, 4321));
   ASSERT (bson_iter_init_find (&iter, &b, "key"));
   ASSERT (BSON_ITER_HOLDS_INT64 (&iter));
   ASSERT (bson_iter_as_double (&iter) == 4321.0);
   bson_destroy (&b);
}